

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O0

void t7(int pi)

{
  undefined4 uVar1;
  int in_EDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int id;
  int oc;
  int c;
  char *in_stack_ffffffffffffffe8;
  int iVar2;
  
  printf("Watchdog tests.\n");
  uVar1 = callback(in_EDI,0x19,1,t7cbf);
  set_watchdog(in_EDI,0x19,0x32);
  time_sleep(0x3fe0000000000000);
  iVar2 = t7_count;
  time_sleep(0x4000000000000000);
  CHECK(unaff_retaddr_00,unaff_retaddr,in_EDI,t7_count - iVar2,iVar2,in_stack_ffffffffffffffe8);
  set_watchdog(in_EDI,0x19,0);
  time_sleep(0x3fe0000000000000);
  iVar2 = t7_count;
  time_sleep(0x4000000000000000);
  CHECK(unaff_retaddr_00,unaff_retaddr,in_EDI,t7_count - iVar2,iVar2,in_stack_ffffffffffffffe8);
  callback_cancel(uVar1);
  return;
}

Assistant:

void t7(int pi)
{
   int c, oc, id;

   printf("Watchdog tests.\n");

   /* type of edge shouldn't matter for watchdogs */
   id = callback(pi, GPIO, FALLING_EDGE, t7cbf);

   set_watchdog(pi, GPIO, 50); /* 50 ms, 20 per second */
   time_sleep(0.5);
   oc = t7_count;
   time_sleep(2);
   c = t7_count - oc;
   CHECK(7, 1, c, 39, 5, "set watchdog on count");

   set_watchdog(pi, GPIO, 0); /* 0 switches watchdog off */
   time_sleep(0.5);
   oc = t7_count;
   time_sleep(2);
   c = t7_count - oc;
   CHECK(7, 2, c, 0, 1, "set watchdog off count");

   callback_cancel(id);
}